

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_command_queue_priority_t priority)

{
  char *pcVar1;
  string local_30;
  
  if (priority == ZE_COMMAND_QUEUE_PRIORITY_PRIORITY_HIGH) {
    pcVar1 = "ZE_COMMAND_QUEUE_PRIORITY_HIGH";
  }
  else if (priority == ZE_COMMAND_QUEUE_PRIORITY_PRIORITY_LOW) {
    pcVar1 = "ZE_COMMAND_QUEUE_PRIORITY_LOW";
  }
  else {
    if (priority != ZE_COMMAND_QUEUE_PRIORITY_NORMAL) {
      std::__cxx11::to_string(&local_30,priority);
      std::operator+(__return_storage_ptr__,"Unknown ze_command_queue_priority_t value: ",&local_30)
      ;
      std::__cxx11::string::~string((string *)&local_30);
      return __return_storage_ptr__;
    }
    pcVar1 = "ZE_COMMAND_QUEUE_PRIORITY_NORMAL";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_command_queue_priority_t priority) {
  if (priority == ZE_COMMAND_QUEUE_PRIORITY_NORMAL) {
    return "ZE_COMMAND_QUEUE_PRIORITY_NORMAL";
  } else if (priority == ZE_COMMAND_QUEUE_PRIORITY_PRIORITY_LOW) {
    return "ZE_COMMAND_QUEUE_PRIORITY_LOW";
  } else if (priority == ZE_COMMAND_QUEUE_PRIORITY_PRIORITY_HIGH) {
    return "ZE_COMMAND_QUEUE_PRIORITY_HIGH";
  } else {
    return "Unknown ze_command_queue_priority_t value: " +
           std::to_string(static_cast<int>(priority));
  }
}